

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::IStreamingReporter> __thiscall
Catch::addListeners(Catch *this,Ptr<const_Catch::IConfig> *config,
                   Ptr<Catch::IStreamingReporter> *reporters)

{
  pointer *this_00;
  IReporterFactory *pIVar1;
  NonCopyable NVar2;
  Catch *pCVar3;
  int iVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  *__x;
  undefined4 extraout_var_00;
  undefined1 auVar6 [8];
  undefined1 local_80 [8];
  Listeners listeners;
  Ptr<const_Catch::IConfig> local_60;
  Catch local_58 [8];
  pointer local_50;
  Ptr<const_Catch::IConfig> *local_48;
  Catch *local_40;
  Ptr<Catch::IStreamingReporter> local_38;
  
  local_48 = config;
  local_40 = this;
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[2])(pIVar5);
  __x = (vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
         *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x20))
                     ((long *)CONCAT44(extraout_var,iVar4));
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::vector((vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
            *)local_80,__x);
  local_50 = listeners.
             super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &listeners.
             super__Vector_base<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (auVar6 = local_80; pCVar3 = local_40, auVar6 != (undefined1  [8])local_50;
      auVar6 = (undefined1  [8])((long)auVar6 + 8)) {
    pIVar1 = ((pointer)auVar6)->m_p;
    ReporterConfig::ReporterConfig((ReporterConfig *)this_00,local_48);
    iVar4 = (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[4])(pIVar1,this_00);
    local_38.m_p = (IStreamingReporter *)CONCAT44(extraout_var_00,iVar4);
    if (local_38.m_p != (IStreamingReporter *)0x0) {
      (*((local_38.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(local_38.m_p);
    }
    addReporter(local_58,reporters,&local_38);
    Ptr<Catch::IStreamingReporter>::operator=(reporters,(Ptr<Catch::IStreamingReporter> *)local_58);
    Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)local_58);
    Ptr<Catch::IStreamingReporter>::~Ptr(&local_38);
    Ptr<const_Catch::IConfig>::~Ptr(&local_60);
  }
  NVar2._vptr_NonCopyable = (_func_int **)reporters->m_p;
  *(_func_int ***)local_40 = NVar2._vptr_NonCopyable;
  if ((NonCopyable)NVar2._vptr_NonCopyable != (NonCopyable)0x0) {
    (**(code **)(*NVar2._vptr_NonCopyable + 0x10))();
  }
  std::
  vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
  ::~vector((vector<Catch::Ptr<Catch::IReporterFactory>,_std::allocator<Catch::Ptr<Catch::IReporterFactory>_>_>
             *)local_80);
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)pCVar3;
}

Assistant:

Ptr<IStreamingReporter> addListeners( Ptr<IConfig const> const& config, Ptr<IStreamingReporter> reporters ) {
        IReporterRegistry::Listeners listeners = getRegistryHub().getReporterRegistry().getListeners();
        for( IReporterRegistry::Listeners::const_iterator it = listeners.begin(), itEnd = listeners.end();
                it != itEnd;
                ++it )
            reporters = addReporter(reporters, (*it)->create( ReporterConfig( config ) ) );
        return reporters;
    }